

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::qualRedCostViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  double dVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  double *in_RDX;
  double *in_RSI;
  SPxSolverBase<double> *in_RDI;
  double x_2;
  double x_1;
  double x;
  int i;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_1c;
  
  *in_RSI = 0.0;
  *in_RDX = 0.0;
  TVar2 = type(in_RDI);
  if (TVar2 == ENTER) {
    for (local_1c = 0; iVar3 = dim((SPxSolverBase<double> *)0x2536cd), local_1c < iVar3;
        local_1c = local_1c + 1) {
      coTest(in_RDI);
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      dVar1 = *pdVar5;
      if ((dVar1 < 0.0) && (*in_RDX = *in_RDX - dVar1, dVar1 < *in_RSI)) {
        *in_RSI = dVar1;
      }
    }
    for (local_1c = 0; iVar3 = coDim((SPxSolverBase<double> *)0x25376b), local_1c < iVar3;
        local_1c = local_1c + 1) {
      test(in_RDI);
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      dVar1 = *pdVar5;
      if ((dVar1 < 0.0) && (*in_RDX = *in_RDX - dVar1, dVar1 < *in_RSI)) {
        *in_RSI = dVar1;
      }
    }
  }
  else {
    local_1c = 0;
    while (iVar3 = local_1c, iVar4 = dim((SPxSolverBase<double> *)0x25380e), iVar3 < iVar4) {
      fTest(in_RDI);
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      dVar1 = *pdVar5;
      if ((dVar1 < 0.0) && (*in_RDX = *in_RDX - dVar1, dVar1 < *in_RSI)) {
        *in_RSI = dVar1;
      }
      local_1c = local_1c + 1;
    }
  }
  *in_RSI = *in_RSI * -1.0;
  return;
}

Assistant:

void SPxSolverBase<R>::qualRedCostViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   int i;

   // TODO:   y = c_B * B^-1  => coSolve(y, c_B)
   //         redcost = c_N - yA_N
   // solve system "x = e_i^T * B^-1" to get i'th row of B^-1
   // VectorBase<R> y( this->nRows() );
   // basis().coSolve( x, spx->unitVector( i ) );
   // VectorBase<R> rdcost( this->nCols() );
   if(type() == ENTER)
   {
      for(i = 0; i < dim(); ++i)
      {
         R x = coTest()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }

      for(i = 0; i < coDim(); ++i)
      {
         R x = test()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }
   }
   else
   {
      assert(type() == LEAVE);

      for(i = 0; i < dim(); ++i)
      {
         R x = fTest()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }
   }

   maxviol *= -1;
}